

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_0::deviceQueueFamilyProperties2
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context)

{
  PlatformInterface *vkp;
  VkPhysicalDevice physicalDevice;
  TestStatus *pTVar1;
  int iVar2;
  long lVar3;
  TestError *pTVar4;
  void **ppvVar5;
  ulong uVar6;
  VkQueueFamilyProperties *__s2;
  pointer __s1;
  bool bVar7;
  deUint32 numExtQueueFamilies;
  deUint32 numCoreQueueFamilies;
  allocator_type local_231;
  vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
  extProperties;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> coreProperties;
  RefBase<vk::VkInstance_s_*> local_1f8;
  TestStatus *local_1e0;
  ulong local_1d8;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  InstanceDriver vki;
  
  vkp = *(PlatformInterface **)(this + 8);
  createInstanceWithExtension((Move<vk::VkInstance_s_*> *)&vki,vkp,(char *)context);
  local_1f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)vki.m_vk.enumeratePhysicalDevices;
  local_1f8.m_data.object = (VkInstance_s *)vki.super_InstanceInterface._vptr_InstanceInterface;
  local_1f8.m_data.deleter.m_destroyInstance = vki.m_vk.destroyInstance;
  vki.super_InstanceInterface._vptr_InstanceInterface = (_func_int **)0x0;
  vki.m_vk.destroyInstance = (DestroyInstanceFunc)0x0;
  vki.m_vk.enumeratePhysicalDevices = (EnumeratePhysicalDevicesFunc)0x0;
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase((RefBase<vk::VkInstance_s_*> *)&vki);
  ::vk::InstanceDriver::InstanceDriver(&vki,vkp,local_1f8.m_data.object);
  local_1e0 = __return_storage_ptr__;
  ::vk::enumeratePhysicalDevices(&devices,&vki.super_InstanceInterface,local_1f8.m_data.object);
  uVar6 = 0;
  while( true ) {
    if ((ulong)((long)devices.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)devices.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&coreProperties,"Querying device queue family properties succeeded",
                 (allocator<char> *)&extProperties);
      pTVar1 = local_1e0;
      tcu::TestStatus::pass(local_1e0,(string *)&coreProperties);
      std::__cxx11::string::~string((string *)&coreProperties);
      std::_Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
      ~_Vector_base(&devices.
                     super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   );
      ::vk::InstanceDriver::~InstanceDriver(&vki);
      ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(&local_1f8);
      return pTVar1;
    }
    physicalDevice =
         devices.
         super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar6];
    numCoreQueueFamilies = 0xffffffff;
    numExtQueueFamilies = 0xffffffff;
    local_1d8 = uVar6;
    ::vk::InstanceDriver::getPhysicalDeviceQueueFamilyProperties
              (&vki,physicalDevice,&numCoreQueueFamilies,(VkQueueFamilyProperties *)0x0);
    ::vk::InstanceDriver::getPhysicalDeviceQueueFamilyProperties2KHR
              (&vki,physicalDevice,&numExtQueueFamilies,(VkQueueFamilyProperties2KHR *)0x0);
    if (numCoreQueueFamilies != numExtQueueFamilies) break;
    if ((ulong)numCoreQueueFamilies == 0) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,(char *)0x0,"numCoreQueueFamilies > 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                 ,0x919);
      goto LAB_004a3977;
    }
    std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::vector
              (&coreProperties,(ulong)numCoreQueueFamilies,(allocator_type *)&extProperties);
    std::vector<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>::
    vector(&extProperties,(ulong)numExtQueueFamilies,&local_231);
    memset(coreProperties.
           super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
           ._M_impl.super__Vector_impl_data._M_start,0xcd,(ulong)numCoreQueueFamilies * 0x18);
    memset(extProperties.
           super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
           ._M_impl.super__Vector_impl_data._M_start,0xcd,(ulong)numExtQueueFamilies * 0x28);
    lVar3 = ((long)extProperties.
                   super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)extProperties.
                  super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28;
    ppvVar5 = &(extProperties.
                super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                ._M_impl.super__Vector_impl_data._M_start)->pNext;
    while (bVar7 = lVar3 != 0, lVar3 = lVar3 + -1, bVar7) {
      ((VkQueueFamilyProperties2KHR *)(ppvVar5 + -1))->sType =
           VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR;
      *ppvVar5 = (void *)0x0;
      ppvVar5 = ppvVar5 + 5;
    }
    ::vk::InstanceDriver::getPhysicalDeviceQueueFamilyProperties
              (&vki,physicalDevice,&numCoreQueueFamilies,
               coreProperties.
               super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
               ._M_impl.super__Vector_impl_data._M_start);
    ::vk::InstanceDriver::getPhysicalDeviceQueueFamilyProperties2KHR
              (&vki,physicalDevice,&numExtQueueFamilies,
               extProperties.
               super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if (((long)coreProperties.
               super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)coreProperties.
              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18 != (ulong)numCoreQueueFamilies) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,(char *)0x0,"(size_t)numCoreQueueFamilies == coreProperties.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                 ,0x92b);
LAB_004a39b6:
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (((long)extProperties.
               super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)extProperties.
              super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x28 != (ulong)numExtQueueFamilies) {
      pTVar4 = (TestError *)
               __cxa_allocate_exception
                         (0x38,extProperties.
                               super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                          ((long)extProperties.
                                 super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)extProperties.
                                super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                                ._M_impl.super__Vector_impl_data._M_start) % 0x28);
      tcu::TestError::TestError
                (pTVar4,(char *)0x0,"(size_t)numExtQueueFamilies == extProperties.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                 ,0x92c);
      goto LAB_004a39b6;
    }
    lVar3 = (ulong)numExtQueueFamilies + 1;
    __s2 = &(extProperties.
             super__Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
             ._M_impl.super__Vector_impl_data._M_start)->queueFamilyProperties;
    __s1 = coreProperties.
           super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
           ._M_impl.super__Vector_impl_data._M_start;
    while (lVar3 = lVar3 + -1, lVar3 != 0) {
      if (*(int *)((long)(__s2 + -1) + 8) != 0x3b9bb07d) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,(char *)0x0,
                   "extProperties[ndx].sType == VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x931);
        goto LAB_004a38da;
      }
      if (*(long *)((long)(__s2 + -1) + 0x10) != 0) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,(char *)0x0,"extProperties[ndx].pNext == DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x932);
        goto LAB_004a38da;
      }
      iVar2 = bcmp(__s1,__s2,0x18);
      __s2 = (VkQueueFamilyProperties *)((long)(__s2 + 1) + 0x10);
      __s1 = __s1 + 1;
      if (iVar2 != 0) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,
                   "Mismatch between format properties reported by vkGetPhysicalDeviceQueueFamilyProperties and vkGetPhysicalDeviceQueueFamilyProperties2KHR"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x935);
LAB_004a38da:
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    std::
    _Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
    ::~_Vector_base((_Vector_base<vk::VkQueueFamilyProperties2KHR,_std::allocator<vk::VkQueueFamilyProperties2KHR>_>
                     *)&extProperties);
    std::_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
    ~_Vector_base(&coreProperties.
                   super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                 );
    uVar6 = local_1d8 + 1;
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"Different number of queue family properties reported",
             "numCoreQueueFamilies == numExtQueueFamilies",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
             ,0x918);
LAB_004a3977:
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus deviceQueueFamilyProperties2 (Context& context)
{
	const PlatformInterface&		vkp			= context.getPlatformInterface();
	const Unique<VkInstance>		instance	(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki			(vkp, *instance);
	const vector<VkPhysicalDevice>	devices		= enumeratePhysicalDevices(vki, *instance);

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		const VkPhysicalDevice	physicalDevice			= devices[deviceNdx];
		deUint32				numCoreQueueFamilies	= ~0u;
		deUint32				numExtQueueFamilies		= ~0u;

		vki.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &numCoreQueueFamilies, DE_NULL);
		vki.getPhysicalDeviceQueueFamilyProperties2KHR(physicalDevice, &numExtQueueFamilies, DE_NULL);

		TCU_CHECK_MSG(numCoreQueueFamilies == numExtQueueFamilies, "Different number of queue family properties reported");
		TCU_CHECK(numCoreQueueFamilies > 0);

		{
			std::vector<VkQueueFamilyProperties>		coreProperties	(numCoreQueueFamilies);
			std::vector<VkQueueFamilyProperties2KHR>	extProperties	(numExtQueueFamilies);

			deMemset(&coreProperties[0], 0xcd, sizeof(VkQueueFamilyProperties)*numCoreQueueFamilies);
			deMemset(&extProperties[0], 0xcd, sizeof(VkQueueFamilyProperties2KHR)*numExtQueueFamilies);

			for (size_t ndx = 0; ndx < extProperties.size(); ++ndx)
			{
				extProperties[ndx].sType = VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR;
				extProperties[ndx].pNext = DE_NULL;
			}

			vki.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &numCoreQueueFamilies, &coreProperties[0]);
			vki.getPhysicalDeviceQueueFamilyProperties2KHR(physicalDevice, &numExtQueueFamilies, &extProperties[0]);

			TCU_CHECK((size_t)numCoreQueueFamilies == coreProperties.size());
			TCU_CHECK((size_t)numExtQueueFamilies == extProperties.size());
			DE_ASSERT(numCoreQueueFamilies == numExtQueueFamilies);

			for (size_t ndx = 0; ndx < extProperties.size(); ++ndx)
			{
				TCU_CHECK(extProperties[ndx].sType == VK_STRUCTURE_TYPE_QUEUE_FAMILY_PROPERTIES_2_KHR);
				TCU_CHECK(extProperties[ndx].pNext == DE_NULL);

				if (deMemCmp(&coreProperties[ndx], &extProperties[ndx].queueFamilyProperties, sizeof(VkQueueFamilyProperties)) != 0)
					TCU_FAIL("Mismatch between format properties reported by vkGetPhysicalDeviceQueueFamilyProperties and vkGetPhysicalDeviceQueueFamilyProperties2KHR");
			}
		}
	}

	return tcu::TestStatus::pass("Querying device queue family properties succeeded");
}